

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.h
# Opt level: O0

Vector3 FBX::getProperty(Node *node,string *property,Vector3 *fallback)

{
  double dVar1;
  double dVar2;
  Vector3 VVar3;
  bool bVar4;
  __type _Var5;
  reference pvVar6;
  vector<FBX::Node,_std::allocator<FBX::Node>_> *this;
  reference pNVar7;
  const_reference pvVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  double *pdVar9;
  Node *prop;
  const_iterator __end1;
  const_iterator __begin1;
  vector<FBX::Node,_std::allocator<FBX::Node>_> *__range1;
  allocator<char> local_c9;
  string local_c8;
  vector<FBX::Node,_std::allocator<FBX::Node>_> local_a8;
  undefined1 local_90 [8];
  Node properties;
  Vector3 *fallback_local;
  string *property_local;
  Node *node_local;
  undefined4 uStack_10;
  float local_c;
  
  properties.properties.
  super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)fallback;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"Properties70",&local_c9);
  findNodes(&local_a8,node,&local_c8);
  pvVar6 = std::vector<FBX::Node,_std::allocator<FBX::Node>_>::operator[](&local_a8,0);
  Node::Node((Node *)local_90,pvVar6);
  std::vector<FBX::Node,_std::allocator<FBX::Node>_>::~vector(&local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  this = (vector<FBX::Node,_std::allocator<FBX::Node>_> *)((long)&properties.id.field_2 + 8);
  __end1 = std::vector<FBX::Node,_std::allocator<FBX::Node>_>::begin(this);
  prop = (Node *)std::vector<FBX::Node,_std::allocator<FBX::Node>_>::end(this);
  do {
    bVar4 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_FBX::Node_*,_std::vector<FBX::Node,_std::allocator<FBX::Node>_>_>
                                *)&prop);
    if (!bVar4) {
      unique0x00012000 =
           *(undefined8 *)
            &((properties.properties.
               super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage)->
             super__Variant_base<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>
             ).
             super__Move_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
             .
             super__Copy_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
             .
             super__Move_ctor_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
             .
             super__Copy_ctor_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
             .
             super__Variant_storage_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
             ._M_u;
      local_c = *(float *)((long)&((properties.properties.
                                    super__Vector_base<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                  super__Variant_base<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>
                                  ).
                                  super__Move_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                                  .
                                  super__Copy_assign_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                                  .
                                  super__Move_ctor_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                                  .
                                  super__Copy_ctor_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                                  .
                                  super__Variant_storage_alias<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char>,_std::vector<float>,_std::vector<int>,_std::vector<double>,_std::vector<long>,_std::vector<bool>,_std::vector<char>_>
                                  ._M_u + 8);
LAB_00126541:
      Node::~Node((Node *)local_90);
      VVar3.z = local_c;
      VVar3.x = (float)node_local._4_4_;
      VVar3.y = (float)uStack_10;
      return VVar3;
    }
    pNVar7 = __gnu_cxx::
             __normal_iterator<const_FBX::Node_*,_std::vector<FBX::Node,_std::allocator<FBX::Node>_>_>
             ::operator*(&__end1);
    pvVar8 = std::
             vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
             ::operator[](&pNVar7->properties,0);
    __lhs = std::
            get<std::__cxx11::string,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                      (pvVar8);
    _Var5 = std::operator==(__lhs,property);
    if (_Var5) {
      pvVar8 = std::
               vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
               ::operator[](&pNVar7->properties,4);
      pdVar9 = std::
               get<double,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                         (pvVar8);
      dVar1 = *pdVar9;
      pvVar8 = std::
               vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
               ::operator[](&pNVar7->properties,5);
      pdVar9 = std::
               get<double,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                         (pvVar8);
      dVar2 = *pdVar9;
      pvVar8 = std::
               vector<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>,_std::allocator<std::variant<short,_bool,_int,_float,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<float,_std::allocator<float>_>,_std::vector<int,_std::allocator<int>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<long,_std::allocator<long>_>,_std::vector<bool,_std::allocator<bool>_>,_std::vector<char,_std::allocator<char>_>_>_>_>
               ::operator[](&pNVar7->properties,6);
      pdVar9 = std::
               get<double,short,bool,int,float,double,long,std::__cxx11::string,std::vector<float,std::allocator<float>>,std::vector<int,std::allocator<int>>,std::vector<double,std::allocator<double>>,std::vector<long,std::allocator<long>>,std::vector<bool,std::allocator<bool>>,std::vector<char,std::allocator<char>>>
                         (pvVar8);
      Vector3::Vector3((Vector3 *)((long)&node_local + 4),(float)dVar1,(float)dVar2,(float)*pdVar9);
      goto LAB_00126541;
    }
    __gnu_cxx::
    __normal_iterator<const_FBX::Node_*,_std::vector<FBX::Node,_std::allocator<FBX::Node>_>_>::
    operator++(&__end1);
  } while( true );
}

Assistant:

static Vector3 getProperty(const Node &node, const std::string &property, const Vector3 &fallback) {
        const Node properties = findNodes(node, "Properties70")[0];

        for (const auto &prop : properties.children)
            if (std::get<std::string>(prop.properties[0]) == property)
                return {
                        static_cast<float>(std::get<double>(prop.properties[4])),
                        static_cast<float>(std::get<double>(prop.properties[5])),
                        static_cast<float>(std::get<double>(prop.properties[6]))
                };
        return fallback;
    }